

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_util.h
# Opt level: O1

void webrtc::DownmixInterleavedToMonoImpl<short,int>
               (short *interleaved,size_t num_frames,int num_channels,short *deinterleaved)

{
  int iVar1;
  string *result;
  long lVar2;
  short *psVar3;
  short *psVar4;
  size_t local_1a0;
  int local_194;
  FatalMessage local_190;
  
  local_194 = 0;
  local_1a0 = num_frames;
  local_190._0_4_ = num_channels;
  if (num_channels < 1) {
    result = rtc::MakeCheckOpString<int,int>((int *)&local_190,&local_194,"num_channels > 0");
  }
  else {
    result = (string *)0x0;
  }
  if (result == (string *)0x0) {
    local_190._0_4_ = 0;
    if (local_1a0 == 0) {
      result = rtc::MakeCheckOpString<unsigned_long,unsigned_int>
                         (&local_1a0,(uint *)&local_190,"num_frames > 0u");
    }
    else {
      result = (string *)0x0;
    }
    if (result == (string *)0x0) {
      lVar2 = local_1a0 * (long)num_channels;
      if (0 < lVar2) {
        psVar4 = interleaved;
        do {
          psVar3 = psVar4 + 1;
          iVar1 = (int)*psVar4;
          if (1 < num_channels) {
            do {
              iVar1 = iVar1 + *psVar3;
              psVar3 = psVar3 + 1;
            } while (psVar3 < psVar4 + num_channels);
          }
          *deinterleaved = (short)(iVar1 / num_channels);
          deinterleaved = deinterleaved + 1;
          psVar4 = psVar3;
        } while (psVar3 < interleaved + lVar2);
      }
      return;
    }
    iVar1 = 0x9d;
  }
  else {
    iVar1 = 0x9c;
  }
  rtc::FatalMessage::FatalMessage
            (&local_190,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/include/audio_util.h"
             ,iVar1,result);
  rtc::FatalMessage::~FatalMessage(&local_190);
}

Assistant:

void DownmixInterleavedToMonoImpl(const T* interleaved,
                                  size_t num_frames,
                                  int num_channels,
                                  T* deinterleaved) {
  RTC_DCHECK_GT(num_channels, 0);
  RTC_DCHECK_GT(num_frames, 0u);

  const T* const end = interleaved + num_frames * num_channels;

  while (interleaved < end) {
    const T* const frame_end = interleaved + num_channels;

    Intermediate value = *interleaved++;
    while (interleaved < frame_end) {
      value += *interleaved++;
    }

    *deinterleaved++ = value / num_channels;
  }
}